

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::IndexPropertyDescriptorMap::Add
          (IndexPropertyDescriptorMap *this,uint32 key,IndexPropertyDescriptor *value)

{
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  uint32 local_c [2];
  uint32 key_local;
  
  this_00 = (this->indexPropertyMap).ptr;
  local_c[0] = key;
  if (this_00->count - this_00->freeCount < 0x3fffffff) {
    (this->indexList).ptr = (uint *)0x0;
    JsUtil::
    BaseDictionary<unsigned_int,Js::IndexPropertyDescriptor,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_int,Js::IndexPropertyDescriptor,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<unsigned_int,Js::IndexPropertyDescriptor,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this_00,local_c,value);
    return;
  }
  Throw::OutOfMemory();
}

Assistant:

void IndexPropertyDescriptorMap::Add(uint32 key, const IndexPropertyDescriptor& value)
    {
        if (indexPropertyMap->Count() >= (INT_MAX / 2))
        {
            Js::Throw::OutOfMemory(); // Would possibly overflow our dictionary
        }

        indexList = nullptr; // Discard indexList on change
        indexPropertyMap->Add(key, value);
    }